

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

ptr<req_msg> __thiscall
nuraft::raft_server::create_sync_snapshot_req
          (raft_server *this,ptr<peer> *pp,ulong last_log_idx,ulong term,ulong commit_idx,
          bool *succeeded_out)

{
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong uVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  int32 iVar7;
  uint uVar8;
  snapshot_io_mgr *this_01;
  size_t sVar9;
  __uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
  this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong size;
  ulong uVar10;
  long lVar11;
  ptr<req_msg> pVar12;
  undefined1 *in_stack_00000008;
  bool last_request;
  undefined1 local_128 [32];
  ptr<snapshot> snp;
  ptr<snapshot_sync_ctx> sync_ctx;
  ptr<buffer> data;
  undefined1 local_c4 [4];
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  ulong term_local;
  undefined1 local_b0 [16];
  ptr<raft_server> local_a0;
  ptr<raft_params> params;
  ulong commit_idx_local;
  undefined1 local_74 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_50;
  unique_lock<std::mutex> guard;
  
  *in_stack_00000008 = 0;
  this_00 = *(peer **)last_log_idx;
  term_local = commit_idx;
  nuraft::context::get_params((context *)&params);
  std::unique_lock<std::mutex>::unique_lock(&guard,&this_00->lock_);
  peer::get_snapshot_sync_ctx((peer *)&sync_ctx);
  snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    uVar10 = 0;
LAB_001c8883:
    get_last_snapshot((raft_server *)local_128);
    std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    if ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->last_log_idx_
        < term)) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 1 < iVar6)) {
        p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_128,
                   "system is running into fatal errors, failed to find a snapshot for peer %d (snapshot null: %d, snapshot doesn\'t contais lastLogIndex: %d)"
                   ,(ulong)(uint)((this_00->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,
                   (ulong)(snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr == (element_type *)0x0),
                   (ulong)((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->last_log_idx_ < term));
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x78,local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      if (((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) &&
          (p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
          )) && (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 1 < iVar6)) {
        p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_128,"last log idx %lu, snp last log idx %lu",term,
                   (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   last_log_idx_);
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x7b,local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      pp_Var4 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var4 + 0x40))(pp_Var4,0xfffffffffffffff0);
      goto LAB_001c8ef4;
    }
    if (((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
         raw_binary) &&
       ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_ == 0))
    {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 1 < iVar6)) {
        p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_128,
                   "invalid snapshot, this usually means a bug from state machine implementation, stop the system to prevent further errors"
                  );
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x88,local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      pp_Var4 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var4 + 0x40))(pp_Var4,0xffffffffffffffef);
      goto LAB_001c8ef4;
    }
    if ((((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          last_log_idx_ != uVar10) &&
        (p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
       (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 3 < iVar6)) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_128,
                 "trying to sync snapshot with last index %lu to peer %d, its last log idx %lu",
                 (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 last_log_idx_,
                 (ulong)(uint)((this_00->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,term);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"create_sync_snapshot_req",0x92,local_128);
      std::__cxx11::string::~string((string *)local_128);
    }
    if (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                );
      destroy_user_snp_ctx((raft_server *)pp,(ptr<snapshot_sync_ctx> *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
    nuraft::context::get_params((context *)local_128);
    iVar6 = *(int *)(local_128._0_8_ + 8);
    lVar11 = (long)DAT_005e29c8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    peer::set_snapshot_in_sync(this_00,&snp,lVar11 * iVar6);
  }
  else {
    std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
               &((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->snapshot_).
                super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
    p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_128,
                 "previous sync_ctx exists %p, offset %lu, snp idx %lu, user_ctx %p",
                 sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,((sync_ctx.
                          super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->field_2).offset_,
                 (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 last_log_idx_,
                 (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->user_snp_ctx_);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"create_sync_snapshot_req",0x5c,local_128);
      std::__cxx11::string::~string((string *)local_128);
    }
    uVar10 = (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             last_log_idx_;
    bVar5 = timer_helper::timeout
                      (&(sync_ctx.
                         super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->timer_);
    if (bVar5) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 3 < iVar6)) {
        p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_128,"previous sync_ctx %p timed out, reset it",
                   sync_ctx.
                   super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x60,local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                );
      destroy_user_snp_ctx((raft_server *)pp,(ptr<snapshot_sync_ctx> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset
                (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                );
      std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::reset
                (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
    }
    if ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       (((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->field_2).offset_ == 0)) goto LAB_001c8883;
  }
  if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      use_bg_thread_for_snapshot_io_ == true) {
    this_01 = snapshot_io_mgr::instance();
    std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::raft_server,void>
              ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
               (__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
               &(pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(local_74 + 4),
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)last_log_idx);
    snapshot_io_mgr::push
              (this_01,&local_a0,(ptr<peer> *)(local_74 + 4),
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)&pp[(ulong)(*(element_type **)last_log_idx ==
                             pp[0x3a].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr) * 2 + 0x58].
                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    *in_stack_00000008 = 1;
    this->_vptr_raft_server = (_func_int **)0x0;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    goto LAB_001c8d2e;
  }
  last_request = false;
  data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
      raw_binary) {
    peer::get_snapshot_sync_ctx((peer *)local_128);
    uVar10 = *(ulong *)(local_128._0_8_ + 0x18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    uVar2 = (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_;
    iVar7 = get_snapshot_sync_block_size((raft_server *)pp);
    size = 0;
    if (uVar10 <= uVar2) {
      size = uVar2 - uVar10;
    }
    if ((ulong)(long)iVar7 <= size) {
      size = (long)iVar7;
    }
    buffer::alloc((buffer *)local_128,size);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    peVar3 = pp[0x2f].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = (*(code *)(peVar3->config_).
                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                      endpoint_.field_2._M_allocated_capacity)
                      (peVar3,snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar10,
                       data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar9 = buffer::size(data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if ((ulong)(long)(int)uVar8 < sVar9) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 1 < iVar6)) {
        p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        sVar9 = buffer::size(data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
        msg_if_given_abi_cxx11_
                  ((string *)local_128,
                   "only %d bytes could be read from snapshot while %zu bytes are expected, must be something wrong, exit."
                   ,(ulong)uVar8,sVar9);
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0xbc,local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      pp_Var4 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var4 + 0x40))(pp_Var4,0xffffffffffffffee);
LAB_001c8ef4:
      exit(-1);
    }
    sVar9 = buffer::size(data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    last_request = (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   size_ <= sVar9 + uVar10;
LAB_001c8c27:
    this_02.
    super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
    ._M_t.
    super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
    .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl =
         (__uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
          )operator_new(0x30);
    snapshot_sync_req::snapshot_sync_req
              ((snapshot_sync_req *)
               this_02.
               super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
               ._M_t.
               super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
               .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl,&snp,uVar10,
               &data,last_request);
    local_c4 = (undefined1  [4])0x10;
    local_74._0_4_ =
         ((this_00->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->id_;
    local_128._0_8_ =
         (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         last_log_term_;
    local_b0._0_8_ =
         (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         last_log_idx_;
    sync_req._M_t.
    super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
    ._M_t.
    super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
    .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl =
         (__uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
          )(__uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
            )this_02.
             super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
             ._M_t.
             super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
             .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl;
    std::
    make_shared<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long&>
              ((unsigned_long *)this,(msg_type *)&term_local,(int *)local_c4,
               (int *)&pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(unsigned_long *)local_74,(unsigned_long *)local_128,
               (unsigned_long *)local_b0);
    pp_Var4 = this->_vptr_raft_server;
    snapshot_sync_req::serialize((snapshot_sync_req *)local_b0);
    local_c4[0] = 5;
    std::
    make_shared<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((unsigned_long *)local_128,(shared_ptr<nuraft::buffer> *)&term_local,local_b0);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>::
    emplace_back<std::shared_ptr<nuraft::log_entry>>
              ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                *)(pp_Var4 + 7),(shared_ptr<nuraft::log_entry> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    *in_stack_00000008 = 1;
    std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>::
    ~unique_ptr(&sync_req);
  }
  else {
    peer::get_snapshot_sync_ctx((peer *)local_128);
    std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    uVar10 = ((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->field_2).offset_;
    p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 4 < iVar6)) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_128,"peer: %d, obj_idx: %lu, user_snp_ctx %p",
                 (ulong)(uint)((this_00->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,uVar10,
                 (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->user_snp_ctx_);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"create_sync_snapshot_req",0xcc,local_128);
      std::__cxx11::string::~string((string *)local_128);
    }
    peVar3 = pp[0x2f].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = (**(code **)((long)&(peVar3->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr[1].endpoint_.field_2 + 8))
                      (peVar3,snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,
                       &(sync_ctx.
                         super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->user_snp_ctx_,uVar10,&data,&last_request);
    if (-1 < (int)uVar8) {
      if (data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        buffer::pos(data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
      }
      goto LAB_001c8c27;
    }
    p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar6 = (*p_Var1->_vptr__Sp_counted_base[7])(), 2 < iVar6)) {
      p_Var1 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_128,"reading snapshot (idx %lu, term %lu, object %lu) failed: %d",
                 (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 last_log_idx_,
                 (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 last_log_term_,uVar10,(ulong)uVar8);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"create_sync_snapshot_req",0xd6,local_128);
      std::__cxx11::string::~string((string *)local_128);
    }
    clear_snapshot_sync_ctx((raft_server *)pp,this_00);
    this->_vptr_raft_server = (_func_int **)0x0;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001c8d2e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&guard);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  pVar12.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar12.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<req_msg>)pVar12.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_sync_snapshot_req(ptr<peer>& pp,
                                                   ulong last_log_idx,
                                                   ulong term,
                                                   ulong commit_idx,
                                                   bool& succeeded_out) {
    succeeded_out = false;
    peer& p = *pp;
    ptr<raft_params> params = ctx_->get_params();
    std::unique_lock<std::mutex> guard(p.get_lock());
    ptr<snapshot_sync_ctx> sync_ctx = p.get_snapshot_sync_ctx();
    ptr<snapshot> snp = nullptr;
    ulong prev_sync_snp_log_idx = 0;
    if (sync_ctx) {
        snp = sync_ctx->get_snapshot();
        p_db( "previous sync_ctx exists %p, offset %" PRIu64 ", snp idx %" PRIu64
              ", user_ctx %p",
              sync_ctx.get(),
              sync_ctx->get_offset(),
              snp->get_last_log_idx(),
              sync_ctx->get_user_snp_ctx() );
        prev_sync_snp_log_idx = snp->get_last_log_idx();

        if (sync_ctx->get_timer().timeout()) {
            p_in("previous sync_ctx %p timed out, reset it", sync_ctx.get());
            destroy_user_snp_ctx(sync_ctx);
            sync_ctx.reset();
            snp.reset();
        }
    }

    // Modified by Jung-Sang Ahn, May 15 2018:
    //   Even though new snapshot has been created,
    //   keep using existing snapshot, as new snapshot will reset
    //   previous catching-up.
    //
    // if ( !snp /*||
    //      ( last_snapshot_ &&
    //        last_snapshot_->get_last_log_idx() > snp->get_last_log_idx() )*/ ) {
    if ( !snp || sync_ctx->get_offset() == 0 ) {
        snp = get_last_snapshot();
        if ( snp == nilptr ||
             last_log_idx > snp->get_last_log_idx() ) {
            // LCOV_EXCL_START
            p_er( "system is running into fatal errors, failed to find a "
                  "snapshot for peer %d (snapshot null: %d, snapshot "
                  "doesn't contais lastLogIndex: %d)",
                  p.get_id(), snp == nilptr ? 1 : 0,
                  last_log_idx > snp->get_last_log_idx() ? 1 : 0 );
            if (snp) {
                p_er("last log idx %" PRIu64 ", snp last log idx %" PRIu64,
                     last_log_idx, snp->get_last_log_idx());
            }
            ctx_->state_mgr_->system_exit(raft_err::N16_snapshot_for_peer_not_found);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if ( snp->get_type() == snapshot::raw_binary &&
             snp->size() < 1L ) {
            // LCOV_EXCL_START
            p_er("invalid snapshot, this usually means a bug from state "
                 "machine implementation, stop the system to prevent "
                 "further errors");
            ctx_->state_mgr_->system_exit(raft_err::N17_empty_snapshot);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if (snp->get_last_log_idx() != prev_sync_snp_log_idx) {
            p_in( "trying to sync snapshot with last index %" PRIu64 " to peer %d, "
                  "its last log idx %" PRIu64 "",
                  snp->get_last_log_idx(), p.get_id(), last_log_idx );
        }
        if (sync_ctx) {
            // If previous user context exists, should free it
            // as it causes memory leak.
            destroy_user_snp_ctx(sync_ctx);
        }

        // Timeout: heartbeat * response limit.
        ulong snp_timeout_ms = ctx_->get_params()->heart_beat_interval_ *
                               raft_server::raft_limits_.response_limit_;
        p.set_snapshot_in_sync(snp, snp_timeout_ms);
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // If async snapshot IO, push the snapshot read request to the manager
        // and immediately return here.
        snapshot_io_mgr::instance().push( this->shared_from_this(),
                                          pp,
                                          ( (pp == srv_to_join_)
                                            ? ex_resp_handler_
                                            : resp_handler_ ) );
        succeeded_out = true;
        return nullptr;
    }
    // Otherwise (sync snapshot IO), read the requested object here and then return.

    bool last_request = false;
    ptr<buffer> data = nullptr;
    ulong data_idx = 0;
    if (snp->get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary snapshot (original)
        ulong offset = p.get_snapshot_sync_ctx()->get_offset();
        ulong sz_left = ( snp->size() > offset ) ? ( snp->size() - offset ) : 0;
        int32 blk_sz = get_snapshot_sync_block_size();
        data = buffer::alloc((size_t)(std::min((ulong)blk_sz, sz_left)));
        int32 sz_rd = state_machine_->read_snapshot_data(*snp, offset, *data);
        if ((size_t)sz_rd < data->size()) {
            // LCOV_EXCL_START
            p_er( "only %d bytes could be read from snapshot while %zu "
                  "bytes are expected, must be something wrong, exit.",
                  sz_rd, data->size() );
            ctx_->state_mgr_->system_exit(raft_err::N18_partial_snapshot_block);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }
        last_request = (offset + (ulong)data->size()) >= snp->size();
        data_idx = offset;
        // LCOV_EXCL_STOP

    } else {
        // Logical object type snapshot
        sync_ctx = p.get_snapshot_sync_ctx();
        ulong obj_idx = sync_ctx->get_offset();
        void*& user_snp_ctx = sync_ctx->get_user_snp_ctx();
        p_dv("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
             (int)p.get_id(), obj_idx, user_snp_ctx);

        int rc = state_machine_->read_logical_snp_obj( *snp, user_snp_ctx, obj_idx,
                                                       data, last_request );
        if (rc < 0) {
            p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                  ", object %" PRIu64 ") failed: %d",
                  snp->get_last_log_idx(),
                  snp->get_last_log_term(),
                  obj_idx,
                  rc );
            // Reset the `sync_ctx` so as to retry with the newer version.
            clear_snapshot_sync_ctx(p);
            return nullptr;
        }
        if (data) data->pos(0);
        data_idx = obj_idx;
    }

    std::unique_ptr<snapshot_sync_req> sync_req
        ( new snapshot_sync_req(snp, data_idx, data, last_request) );
    ptr<req_msg> req( cs_new<req_msg>
                      ( term,
                        msg_type::install_snapshot_request,
                        id_,
                        p.get_id(),
                        snp->get_last_log_term(),
                        snp->get_last_log_idx(),
                        commit_idx ) );
    req->log_entries().push_back( cs_new<log_entry>
                                  ( term,
                                    sync_req->serialize(),
                                    log_val_type::snp_sync_req ) );

    succeeded_out = true;
    return req;
}